

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_compare(DisasCompare_conflict1 *cmp,_Bool xcc,uint cond,DisasContext_conflict8 *dc)

{
  uint32_t uVar1;
  TCGContext_conflict8 *tcg_ctx;
  TCGCond TVar2;
  TCGv_i64 pTVar3;
  TCGv_i32 pTVar4;
  TCGv_i64 ret;
  
  tcg_ctx = dc->uc->tcg_ctx;
  uVar1 = dc->cc_op;
  if (uVar1 == 1) goto LAB_0090dd68;
  if (uVar1 == 7) {
    switch(cond) {
    case 6:
    case 0xe:
      TVar2 = cond == 6 ^ TCG_COND_GE;
      break;
    case 7:
    case 0xf:
      goto switchD_0090dcff_caseD_7;
    default:
      cmp->cond = gen_compare::subcc_cond[cond];
      cmp->is_bool = false;
      if (xcc) {
        cmp->g1 = true;
        cmp->g2 = true;
        pTVar3 = tcg_ctx->cpu_cc_src2;
        cmp->c1 = (TCGv_i32)tcg_ctx->cpu_cc_src;
        cmp->c2 = (TCGv_i32)pTVar3;
        return;
      }
      cmp->g1 = false;
      cmp->g2 = false;
      pTVar4 = tcg_temp_new_i64(tcg_ctx);
      cmp->c1 = pTVar4;
      pTVar4 = tcg_temp_new_i64(tcg_ctx);
      cmp->c2 = pTVar4;
      tcg_gen_ext32s_i64_sparc64(tcg_ctx,(TCGv_i64)cmp->c1,tcg_ctx->cpu_cc_src);
      ret = (TCGv_i64)cmp->c2;
      pTVar3 = tcg_ctx->cpu_cc_src2;
      goto LAB_0090dde2;
    }
  }
  else {
    if (uVar1 != 0xb) {
switchD_0090dcff_caseD_7:
      gen_helper_compute_psr(tcg_ctx,tcg_ctx->cpu_env);
      dc->cc_op = 1;
LAB_0090dd68:
      cmp->cond = TCG_COND_NE;
      cmp->is_bool = true;
      cmp->g1 = false;
      cmp->g2 = false;
      pTVar4 = tcg_temp_new_i64(tcg_ctx);
      cmp->c1 = pTVar4;
      pTVar3 = tcg_const_i64_sparc64(tcg_ctx,0);
      cmp->c2 = (TCGv_i32)pTVar3;
      (*(code *)(&DAT_00bb4280 + *(int *)(&DAT_00bb4280 + (ulong)cond * 4)))();
      return;
    }
    TVar2 = gen_compare::logic_cond[cond];
  }
  cmp->cond = TVar2;
  cmp->is_bool = false;
  cmp->g2 = false;
  pTVar3 = tcg_const_i64_sparc64(tcg_ctx,0);
  cmp->c2 = (TCGv_i32)pTVar3;
  if (xcc) {
    cmp->g1 = true;
    cmp->c1 = (TCGv_i32)tcg_ctx->cpu_cc_dst;
    return;
  }
  cmp->g1 = false;
  ret = (TCGv_i64)tcg_temp_new_i64(tcg_ctx);
  cmp->c1 = (TCGv_i32)ret;
  pTVar3 = tcg_ctx->cpu_cc_dst;
LAB_0090dde2:
  tcg_gen_ext32s_i64_sparc64(tcg_ctx,ret,pTVar3);
  return;
}

Assistant:

static void gen_compare(DisasCompare *cmp, bool xcc, unsigned int cond,
                        DisasContext *dc)
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    static int subcc_cond[16] = {
        TCG_COND_NEVER,
        TCG_COND_EQ,
        TCG_COND_LE,
        TCG_COND_LT,
        TCG_COND_LEU,
        TCG_COND_LTU,
        -1, /* neg */
        -1, /* overflow */
        TCG_COND_ALWAYS,
        TCG_COND_NE,
        TCG_COND_GT,
        TCG_COND_GE,
        TCG_COND_GTU,
        TCG_COND_GEU,
        -1, /* pos */
        -1, /* no overflow */
    };

    static int logic_cond[16] = {
        TCG_COND_NEVER,
        TCG_COND_EQ,     /* eq:  Z */
        TCG_COND_LE,     /* le:  Z | (N ^ V) -> Z | N */
        TCG_COND_LT,     /* lt:  N ^ V -> N */
        TCG_COND_EQ,     /* leu: C | Z -> Z */
        TCG_COND_NEVER,  /* ltu: C -> 0 */
        TCG_COND_LT,     /* neg: N */
        TCG_COND_NEVER,  /* vs:  V -> 0 */
        TCG_COND_ALWAYS,
        TCG_COND_NE,     /* ne:  !Z */
        TCG_COND_GT,     /* gt:  !(Z | (N ^ V)) -> !(Z | N) */
        TCG_COND_GE,     /* ge:  !(N ^ V) -> !N */
        TCG_COND_NE,     /* gtu: !(C | Z) -> !Z */
        TCG_COND_ALWAYS, /* geu: !C -> 1 */
        TCG_COND_GE,     /* pos: !N */
        TCG_COND_ALWAYS, /* vc:  !V -> 1 */
    };

    TCGv_i32 r_src;
    TCGv r_dst;

#ifdef TARGET_SPARC64
    if (xcc) {
        r_src = tcg_ctx->cpu_xcc;
    } else {
        r_src = tcg_ctx->cpu_psr;
    }
#else
    r_src = tcg_ctx->cpu_psr;
#endif

    switch (dc->cc_op) {
    case CC_OP_LOGIC:
        cmp->cond = logic_cond[cond];
    do_compare_dst_0:
        cmp->is_bool = false;
        cmp->g2 = false;
        cmp->c2 = tcg_const_tl(tcg_ctx, 0);
#ifdef TARGET_SPARC64
        if (!xcc) {
            cmp->g1 = false;
            cmp->c1 = tcg_temp_new(tcg_ctx);
            tcg_gen_ext32s_tl(tcg_ctx, cmp->c1, tcg_ctx->cpu_cc_dst);
            break;
        }
#endif
        cmp->g1 = true;
        cmp->c1 = tcg_ctx->cpu_cc_dst;
        break;

    case CC_OP_SUB:
        switch (cond) {
        case 6:  /* neg */
        case 14: /* pos */
            cmp->cond = (cond == 6 ? TCG_COND_LT : TCG_COND_GE);
            goto do_compare_dst_0;

        case 7: /* overflow */
        case 15: /* !overflow */
            goto do_dynamic;

        default:
            cmp->cond = subcc_cond[cond];
            cmp->is_bool = false;
#ifdef TARGET_SPARC64
            if (!xcc) {
                /* Note that sign-extension works for unsigned compares as
                   long as both operands are sign-extended.  */
                cmp->g1 = cmp->g2 = false;
                cmp->c1 = tcg_temp_new(tcg_ctx);
                cmp->c2 = tcg_temp_new(tcg_ctx);
                tcg_gen_ext32s_tl(tcg_ctx, cmp->c1, tcg_ctx->cpu_cc_src);
                tcg_gen_ext32s_tl(tcg_ctx, cmp->c2, tcg_ctx->cpu_cc_src2);
                break;
            }
#endif
            cmp->g1 = cmp->g2 = true;
            cmp->c1 = tcg_ctx->cpu_cc_src;
            cmp->c2 = tcg_ctx->cpu_cc_src2;
            break;
        }
        break;

    default:
    do_dynamic:
        gen_helper_compute_psr(tcg_ctx, tcg_ctx->cpu_env);
        dc->cc_op = CC_OP_FLAGS;
        /* FALLTHRU */

    case CC_OP_FLAGS:
        /* We're going to generate a boolean result.  */
        cmp->cond = TCG_COND_NE;
        cmp->is_bool = true;
        cmp->g1 = cmp->g2 = false;
        cmp->c1 = r_dst = tcg_temp_new(tcg_ctx);
        cmp->c2 = tcg_const_tl(tcg_ctx, 0);

        switch (cond) {
        case 0x0:
            gen_op_eval_bn(tcg_ctx, r_dst);
            break;
        case 0x1:
            gen_op_eval_be(tcg_ctx, r_dst, r_src);
            break;
        case 0x2:
            gen_op_eval_ble(tcg_ctx, r_dst, r_src);
            break;
        case 0x3:
            gen_op_eval_bl(tcg_ctx, r_dst, r_src);
            break;
        case 0x4:
            gen_op_eval_bleu(tcg_ctx, r_dst, r_src);
            break;
        case 0x5:
            gen_op_eval_bcs(tcg_ctx, r_dst, r_src);
            break;
        case 0x6:
            gen_op_eval_bneg(tcg_ctx, r_dst, r_src);
            break;
        case 0x7:
            gen_op_eval_bvs(tcg_ctx, r_dst, r_src);
            break;
        case 0x8:
            gen_op_eval_ba(tcg_ctx, r_dst);
            break;
        case 0x9:
            gen_op_eval_bne(tcg_ctx, r_dst, r_src);
            break;
        case 0xa:
            gen_op_eval_bg(tcg_ctx, r_dst, r_src);
            break;
        case 0xb:
            gen_op_eval_bge(tcg_ctx, r_dst, r_src);
            break;
        case 0xc:
            gen_op_eval_bgu(tcg_ctx, r_dst, r_src);
            break;
        case 0xd:
            gen_op_eval_bcc(tcg_ctx, r_dst, r_src);
            break;
        case 0xe:
            gen_op_eval_bpos(tcg_ctx, r_dst, r_src);
            break;
        case 0xf:
            gen_op_eval_bvc(tcg_ctx, r_dst, r_src);
            break;
        }
        break;
    }
}